

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_nonblock_begin(nk_context *ctx,nk_flags flags,nk_rect body,nk_rect header,
                     nk_panel_type panel_type)

{
  byte *pbVar1;
  nk_window *pnVar2;
  nk_size nVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  nk_buffer *pnVar7;
  nk_handle nVar8;
  nk_size nVar9;
  nk_size nVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int iVar15;
  int iVar16;
  nk_window *pnVar17;
  nk_panel *pnVar18;
  nk_panel **ppnVar19;
  nk_rect r;
  
  pnVar2 = ctx->current;
  if (pnVar2 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4195,
                  "int nk_nonblock_begin(struct nk_context *, nk_flags, struct nk_rect, struct nk_rect, enum nk_panel_type)"
                 );
  }
  pnVar18 = pnVar2->layout;
  if (pnVar18 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4196,
                  "int nk_nonblock_begin(struct nk_context *, nk_flags, struct nk_rect, struct nk_rect, enum nk_panel_type)"
                 );
  }
  if ((pnVar18->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP)) !=
      NK_PANEL_NONE) {
    __assert_fail("!(panel->type & NK_PANEL_SET_POPUP)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x419d,
                  "int nk_nonblock_begin(struct nk_context *, nk_flags, struct nk_rect, struct nk_rect, enum nk_panel_type)"
                 );
  }
  pnVar17 = (pnVar2->popup).win;
  if (pnVar17 == (nk_window *)0x0) {
    pnVar17 = (nk_window *)nk_create_window(ctx);
    pnVar17->parent = pnVar2;
    (pnVar2->popup).win = pnVar17;
    (pnVar2->popup).type = panel_type;
    (pnVar17->buffer).base = &ctx->memory;
    (pnVar17->buffer).use_clipping = 1;
    nVar3 = (ctx->memory).allocated;
    (pnVar17->buffer).begin = nVar3;
    (pnVar17->buffer).end = nVar3;
    (pnVar17->buffer).last = nVar3;
  }
  else if (((ctx->input).mouse.buttons[0].down != 0) && ((ctx->input).mouse.buttons[0].clicked != 0)
          ) {
    iVar15 = nk_input_is_mouse_hovering_rect(&ctx->input,header);
    iVar16 = nk_input_is_mouse_hovering_rect(&ctx->input,body);
    (pnVar2->popup).header.x = (float)(int)header._0_8_;
    (pnVar2->popup).header.y = (float)(int)((ulong)header._0_8_ >> 0x20);
    (pnVar2->popup).header.w = (float)(int)header._8_8_;
    (pnVar2->popup).header.h = (float)(int)((ulong)header._8_8_ >> 0x20);
    if ((iVar16 == 0) || (iVar15 != 0)) {
      for (; pnVar18 != (nk_panel *)0x0; pnVar18 = pnVar18->parent) {
        pbVar1 = (byte *)((long)&pnVar18->flags + 2);
        *pbVar1 = *pbVar1 | 1;
      }
      return 0;
    }
    goto LAB_0012b83a;
  }
  (pnVar2->popup).header.x = header.x;
  (pnVar2->popup).header.y = header.y;
  (pnVar2->popup).header.w = header.w;
  (pnVar2->popup).header.h = header.h;
LAB_0012b83a:
  (pnVar17->bounds).x = (float)(int)body._0_8_;
  (pnVar17->bounds).y = (float)(int)((ulong)body._0_8_ >> 0x20);
  (pnVar17->bounds).w = (float)(int)body._8_8_;
  (pnVar17->bounds).h = (float)(int)((ulong)body._8_8_ >> 0x20);
  pnVar17->parent = pnVar2;
  pnVar18 = (nk_panel *)nk_create_panel(ctx);
  pnVar17->layout = pnVar18;
  pnVar17->flags = flags | 0x801;
  pnVar17->seq = ctx->seq;
  (pnVar2->popup).active = 1;
  if (pnVar18 != (nk_panel *)0x0) {
    uVar4 = (undefined4)(pnVar2->buffer).end;
    uVar5 = *(undefined4 *)((long)&(pnVar2->buffer).end + 4);
    nVar3 = (pnVar2->buffer).last;
    uVar6 = *(undefined4 *)((long)&(pnVar2->buffer).last + 4);
    *(undefined4 *)&(pnVar2->popup).buf.begin = uVar4;
    *(undefined4 *)((long)&(pnVar2->popup).buf.begin + 4) = uVar5;
    *(int *)&(pnVar2->popup).buf.parent = (int)nVar3;
    *(undefined4 *)((long)&(pnVar2->popup).buf.parent + 4) = uVar6;
    *(undefined4 *)&(pnVar2->popup).buf.last = uVar4;
    *(undefined4 *)((long)&(pnVar2->popup).buf.last + 4) = uVar5;
    *(undefined4 *)&(pnVar2->popup).buf.end = uVar4;
    *(undefined4 *)((long)&(pnVar2->popup).buf.end + 4) = uVar5;
    (pnVar2->popup).buf.active = 1;
    pnVar7 = (pnVar2->buffer).base;
    fVar13 = (pnVar2->buffer).clip.x;
    fVar14 = (pnVar2->buffer).clip.y;
    fVar11 = (pnVar2->buffer).clip.w;
    fVar12 = (pnVar2->buffer).clip.h;
    iVar15 = (pnVar2->buffer).use_clipping;
    uVar4 = *(undefined4 *)&(pnVar2->buffer).field_0x1c;
    nVar8 = (pnVar2->buffer).userdata;
    nVar3 = (pnVar2->buffer).begin;
    nVar9 = (pnVar2->buffer).last;
    (pnVar17->buffer).end = (pnVar2->buffer).end;
    (pnVar17->buffer).last = nVar9;
    (pnVar17->buffer).userdata = nVar8;
    (pnVar17->buffer).begin = nVar3;
    (pnVar17->buffer).clip.w = fVar11;
    (pnVar17->buffer).clip.h = fVar12;
    (pnVar17->buffer).use_clipping = iVar15;
    *(undefined4 *)&(pnVar17->buffer).field_0x1c = uVar4;
    (pnVar17->buffer).base = pnVar7;
    (pnVar17->buffer).clip.x = fVar13;
    (pnVar17->buffer).clip.y = fVar14;
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(&pnVar17->buffer,r);
    ctx->current = pnVar17;
    nk_panel_begin(ctx,(char *)0x0,panel_type);
    fVar11 = (pnVar17->buffer).clip.x;
    fVar12 = (pnVar17->buffer).clip.y;
    fVar13 = (pnVar17->buffer).clip.w;
    fVar14 = (pnVar17->buffer).clip.h;
    iVar15 = (pnVar17->buffer).use_clipping;
    uVar4 = *(undefined4 *)&(pnVar17->buffer).field_0x1c;
    nVar8 = (pnVar17->buffer).userdata;
    nVar3 = (pnVar17->buffer).begin;
    nVar9 = (pnVar17->buffer).end;
    nVar10 = (pnVar17->buffer).last;
    (pnVar2->buffer).base = (pnVar17->buffer).base;
    (pnVar2->buffer).clip.x = fVar11;
    (pnVar2->buffer).clip.y = fVar12;
    (pnVar2->buffer).clip.w = fVar13;
    (pnVar2->buffer).clip.h = fVar14;
    (pnVar2->buffer).use_clipping = iVar15;
    *(undefined4 *)&(pnVar2->buffer).field_0x1c = uVar4;
    (pnVar2->buffer).userdata = nVar8;
    (pnVar2->buffer).begin = nVar3;
    (pnVar2->buffer).end = nVar9;
    (pnVar2->buffer).last = nVar10;
    pnVar18 = pnVar17->layout;
    pnVar18->parent = pnVar2->layout;
    pnVar18->offset_x = &(pnVar17->scrollbar).x;
    pnVar18->offset_y = &(pnVar17->scrollbar).y;
    ppnVar19 = &pnVar2->layout;
    while (pnVar18 = *ppnVar19, pnVar18 != (nk_panel *)0x0) {
      pbVar1 = (byte *)((long)&pnVar18->flags + 1);
      *pbVar1 = *pbVar1 | 0x10;
      ppnVar19 = &pnVar18->parent;
    }
    return 1;
  }
  __assert_fail("popup->layout",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x41c3,
                "int nk_nonblock_begin(struct nk_context *, nk_flags, struct nk_rect, struct nk_rect, enum nk_panel_type)"
               );
}

Assistant:

NK_LIB int
nk_nonblock_begin(struct nk_context *ctx,
    nk_flags flags, struct nk_rect body, struct nk_rect header,
    enum nk_panel_type panel_type)
{
    struct nk_window *popup;
    struct nk_window *win;
    struct nk_panel *panel;
    int is_active = nk_true;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    /* popups cannot have popups */
    win = ctx->current;
    panel = win->layout;
    NK_ASSERT(!(panel->type & NK_PANEL_SET_POPUP));
    (void)panel;
    popup = win->popup.win;
    if (!popup) {
        /* create window for nonblocking popup */
        popup = (struct nk_window*)nk_create_window(ctx);
        popup->parent = win;
        win->popup.win = popup;
        win->popup.type = panel_type;
        nk_command_buffer_init(&popup->buffer, &ctx->memory, NK_CLIPPING_ON);
    } else {
        /* close the popup if user pressed outside or in the header */
        int pressed, in_body, in_header;
        pressed = nk_input_is_mouse_pressed(&ctx->input, NK_BUTTON_LEFT);
        in_body = nk_input_is_mouse_hovering_rect(&ctx->input, body);
        in_header = nk_input_is_mouse_hovering_rect(&ctx->input, header);
        if (pressed && (!in_body || in_header))
            is_active = nk_false;
    }
    win->popup.header = header;

    if (!is_active) {
        /* remove read only mode from all parent panels */
        struct nk_panel *root = win->layout;
        while (root) {
            root->flags |= NK_WINDOW_REMOVE_ROM;
            root = root->parent;
        }
        return is_active;
    }
    popup->bounds = body;
    popup->parent = win;
    popup->layout = (struct nk_panel*)nk_create_panel(ctx);
    popup->flags = flags;
    popup->flags |= NK_WINDOW_BORDER;
    popup->flags |= NK_WINDOW_DYNAMIC;
    popup->seq = ctx->seq;
    win->popup.active = 1;
    NK_ASSERT(popup->layout);

    nk_start_popup(ctx, win);
    popup->buffer = win->buffer;
    nk_push_scissor(&popup->buffer, nk_null_rect);
    ctx->current = popup;

    nk_panel_begin(ctx, 0, panel_type);
    win->buffer = popup->buffer;
    popup->layout->parent = win->layout;
    popup->layout->offset_x = &popup->scrollbar.x;
    popup->layout->offset_y = &popup->scrollbar.y;

    /* set read only mode to all parent panels */
    {struct nk_panel *root;
    root = win->layout;
    while (root) {
        root->flags |= NK_WINDOW_ROM;
        root = root->parent;
    }}
    return is_active;
}